

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O1

void __thiscall CriticalSectionsBuilder::preVisit(CriticalSectionsBuilder *this,Node *node)

{
  Node *pNVar1;
  NodeType NVar2;
  pair<std::_Rb_tree_iterator<UnlockNode_*>,_std::_Rb_tree_iterator<UnlockNode_*>_> pVar3;
  type *unlockNode;
  Node *local_20;
  Node *local_18;
  
  local_18 = node;
  std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
  _M_insert_unique<Node*const&>
            ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *)
             &this->visited_,&local_18);
  pNVar1 = local_18;
  if (local_18 == (Node *)0x0) {
    local_20 = (Node *)0x0;
  }
  else {
    NVar2 = Node::getType(local_18);
    local_20 = (Node *)0x0;
    if (NVar2 == UNLOCK) {
      local_20 = pNVar1;
    }
  }
  if (local_20 != (Node *)0x0) {
    pVar3 = std::
            _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
            ::equal_range(&(this->currentUnlocks)._M_t,(key_type *)&local_20);
    std::
    _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
    ::_M_erase_aux(&(this->currentUnlocks)._M_t,(_Base_ptr)pVar3.first._M_node,
                   (_Base_ptr)pVar3.second._M_node);
  }
  return;
}

Assistant:

void CriticalSectionsBuilder::preVisit(Node *node) {
    visited_.insert(node);
    if (auto *unlockNode = castNode<NodeType::UNLOCK>(node)) {
        currentUnlocks.erase(unlockNode);
    }
}